

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtOverlappingPairCache.cpp
# Opt level: O3

cbtBroadphasePair * __thiscall
cbtHashedOverlappingPairCache::internalAddPair
          (cbtHashedOverlappingPairCache *this,cbtBroadphaseProxy *proxy0,cbtBroadphaseProxy *proxy1
          )

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint uVar4;
  cbtOverlappingPairCallback *pcVar5;
  int *piVar6;
  undefined8 uVar7;
  uint uVar8;
  uint uVar9;
  cbtBroadphasePair *pcVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  cbtBroadphasePair *pcVar16;
  cbtBroadphaseProxy *pcVar17;
  cbtBroadphaseProxy *pcVar18;
  
  uVar3 = (this->m_overlappingPairArray).m_capacity;
  pcVar17 = proxy0;
  if (proxy1->m_uniqueId < proxy0->m_uniqueId) {
    pcVar17 = proxy1;
    proxy1 = proxy0;
  }
  uVar12 = proxy1->m_uniqueId << 0x10 | pcVar17->m_uniqueId;
  uVar12 = ~(uVar12 << 0xf) + uVar12;
  uVar12 = (uVar12 >> 10 ^ uVar12) * 9;
  uVar12 = uVar12 >> 6 ^ uVar12;
  uVar12 = ~(uVar12 << 0xb) + uVar12;
  uVar12 = uVar12 >> 0x10 ^ uVar12;
  uVar15 = (ulong)(int)(uVar3 - 1 & uVar12);
  iVar14 = (this->m_hashTable).m_data[uVar15];
  if (iVar14 != -1) {
    pcVar10 = (this->m_overlappingPairArray).m_data;
    do {
      if (((pcVar10[iVar14].m_pProxy0)->m_uniqueId == pcVar17->m_uniqueId) &&
         (pcVar16 = pcVar10 + iVar14, pcVar16->m_pProxy1->m_uniqueId == proxy1->m_uniqueId)) {
        return pcVar16;
      }
      iVar14 = (this->m_next).m_data[iVar14];
    } while (iVar14 != -1);
  }
  uVar4 = (this->m_overlappingPairArray).m_size;
  uVar8 = uVar4;
  uVar9 = uVar3;
  if (uVar4 == uVar3) {
    uVar13 = 1;
    if (uVar3 != 0) {
      uVar13 = uVar3 * 2;
    }
    uVar8 = uVar3;
    if ((int)uVar3 < (int)uVar13) {
      if (uVar13 == 0) {
        pcVar10 = (cbtBroadphasePair *)0x0;
      }
      else {
        pcVar10 = (cbtBroadphasePair *)cbtAlignedAllocInternal((long)(int)uVar13 << 5,0x10);
        uVar8 = (this->m_overlappingPairArray).m_size;
      }
      if (0 < (int)uVar8) {
        lVar11 = 0;
        do {
          pcVar16 = (this->m_overlappingPairArray).m_data;
          puVar1 = (undefined8 *)((long)&pcVar16->m_pProxy0 + lVar11);
          uVar7 = puVar1[1];
          puVar2 = (undefined8 *)((long)&pcVar10->m_pProxy0 + lVar11);
          *puVar2 = *puVar1;
          puVar2[1] = uVar7;
          *(undefined8 *)((long)&pcVar10->m_algorithm + lVar11) =
               *(undefined8 *)((long)&pcVar16->m_algorithm + lVar11);
          *(undefined8 *)((long)&pcVar10->field_3 + lVar11) =
               *(undefined8 *)((long)&pcVar16->field_3 + lVar11);
          lVar11 = lVar11 + 0x20;
        } while ((ulong)uVar8 << 5 != lVar11);
      }
      pcVar16 = (this->m_overlappingPairArray).m_data;
      if ((pcVar16 != (cbtBroadphasePair *)0x0) &&
         ((this->m_overlappingPairArray).m_ownsMemory == true)) {
        cbtAlignedFreeInternal(pcVar16);
      }
      (this->m_overlappingPairArray).m_ownsMemory = true;
      (this->m_overlappingPairArray).m_data = pcVar10;
      (this->m_overlappingPairArray).m_capacity = uVar13;
      uVar8 = (this->m_overlappingPairArray).m_size;
      uVar9 = uVar13;
    }
  }
  (this->m_overlappingPairArray).m_size = uVar8 + 1;
  pcVar10 = (this->m_overlappingPairArray).m_data + (int)uVar4;
  pcVar5 = this->m_ghostPairCallback;
  if (pcVar5 != (cbtOverlappingPairCallback *)0x0) {
    (*pcVar5->_vptr_cbtOverlappingPairCallback[2])(pcVar5,pcVar17,proxy1);
    uVar9 = (this->m_overlappingPairArray).m_capacity;
  }
  if ((int)uVar3 < (int)uVar9) {
    growTables(this);
    uVar15 = (long)(int)uVar12 & (long)(this->m_overlappingPairArray).m_capacity - 1U;
  }
  pcVar18 = pcVar17;
  if (pcVar17->m_uniqueId < proxy1->m_uniqueId) {
    pcVar18 = proxy1;
    proxy1 = pcVar17;
  }
  pcVar10->m_pProxy0 = proxy1;
  pcVar10->m_pProxy1 = pcVar18;
  pcVar10->m_algorithm = (cbtCollisionAlgorithm *)0x0;
  (pcVar10->field_3).m_internalInfo1 = (void *)0x0;
  piVar6 = (this->m_hashTable).m_data;
  (this->m_next).m_data[(int)uVar4] = piVar6[uVar15];
  piVar6[uVar15] = uVar4;
  return pcVar10;
}

Assistant:

cbtBroadphasePair* cbtHashedOverlappingPairCache::internalAddPair(cbtBroadphaseProxy* proxy0, cbtBroadphaseProxy* proxy1)
{
	if (proxy0->m_uniqueId > proxy1->m_uniqueId)
		cbtSwap(proxy0, proxy1);
	int proxyId1 = proxy0->getUid();
	int proxyId2 = proxy1->getUid();

	/*if (proxyId1 > proxyId2) 
		cbtSwap(proxyId1, proxyId2);*/

	int hash = static_cast<int>(getHash(static_cast<unsigned int>(proxyId1), static_cast<unsigned int>(proxyId2)) & (m_overlappingPairArray.capacity() - 1));  // New hash value with new mask

	cbtBroadphasePair* pair = internalFindPair(proxy0, proxy1, hash);
	if (pair != NULL)
	{
		return pair;
	}
	/*for(int i=0;i<m_overlappingPairArray.size();++i)
		{
		if(	(m_overlappingPairArray[i].m_pProxy0==proxy0)&&
			(m_overlappingPairArray[i].m_pProxy1==proxy1))
			{
			printf("Adding duplicated %u<>%u\r\n",proxyId1,proxyId2);
			internalFindPair(proxy0, proxy1, hash);
			}
		}*/
	int count = m_overlappingPairArray.size();
	int oldCapacity = m_overlappingPairArray.capacity();
	void* mem = &m_overlappingPairArray.expandNonInitializing();

	//this is where we add an actual pair, so also call the 'ghost'
	if (m_ghostPairCallback)
		m_ghostPairCallback->addOverlappingPair(proxy0, proxy1);

	int newCapacity = m_overlappingPairArray.capacity();

	if (oldCapacity < newCapacity)
	{
		growTables();
		//hash with new capacity
		hash = static_cast<int>(getHash(static_cast<unsigned int>(proxyId1), static_cast<unsigned int>(proxyId2)) & (m_overlappingPairArray.capacity() - 1));
	}

	pair = new (mem) cbtBroadphasePair(*proxy0, *proxy1);
	//	pair->m_pProxy0 = proxy0;
	//	pair->m_pProxy1 = proxy1;
	pair->m_algorithm = 0;
	pair->m_internalTmpValue = 0;

	m_next[count] = m_hashTable[hash];
	m_hashTable[hash] = count;

	return pair;
}